

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetCubePairNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  ulong uVar2;
  int local_40;
  ulong local_30;
  word nCubePairs;
  word nCubes;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_30 = 0;
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x93,"int Abc_NtkGetCubePairNum(Abc_Ntk_t *)");
  }
  nCubes._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= nCubes._4_4_) {
      if (local_30 < 0x40000001) {
        local_40 = (int)local_30;
      }
      else {
        local_40 = 0x40000000;
      }
      return local_40;
    }
    pObj = Abc_NtkObj(pNtk,nCubes._4_4_);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
       (iVar1 = Abc_NodeIsConst(pObj), iVar1 == 0)) {
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0x98,"int Abc_NtkGetCubePairNum(Abc_Ntk_t *)");
      }
      iVar1 = Abc_SopGetCubeNum((char *)(pObj->field_5).pData);
      uVar2 = (ulong)iVar1;
      if (1 < uVar2) {
        local_30 = (uVar2 * (uVar2 - 1) >> 1) + local_30;
      }
    }
    nCubes._4_4_ = nCubes._4_4_ + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetCubePairNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    word nCubes, nCubePairs = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_NodeIsConst(pNode) )
            continue;
        assert( pNode->pData );
        nCubes = (word)Abc_SopGetCubeNum( (char *)pNode->pData );
        if ( nCubes > 1 )
            nCubePairs += nCubes * (nCubes - 1) / 2;
    }
    return (int)(nCubePairs > (1<<30) ? (1<<30) : nCubePairs);
}